

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O3

void emit_binary_op(function *fn,int A,int B,int C,OpCode op,int pc)

{
  membuff_t *mb;
  
  emit_reg(fn,"ra",A);
  emit_reg_or_k(fn,"rb",B);
  emit_reg_or_k(fn,"rc",C);
  mb = &fn->body;
  membuff_add_fstring(mb,"ci->u.l.savedpc = &cl->p->code[%d+1];\n",(ulong)(uint)pc);
  membuff_add_fstring(mb,"luaO_arith(L, %d, rb, rc, ra);\n",(ulong)(op - OP_ADD));
  membuff_add_string(mb,"base = ci->u.l.base;\n");
  return;
}

Assistant:

static void emit_binary_op(struct function *fn, int A, int B, int C, OpCode op, int pc) {
  emit_reg(fn, "ra", A);
  emit_reg_or_k(fn, "rb", B);
  emit_reg_or_k(fn, "rc", C);
  emit_update_savedpc(fn, pc);
  membuff_add_fstring(&fn->body, "luaO_arith(L, %d, rb, rc, ra);\n", cast_int(op - OP_ADD));
  membuff_add_string(&fn->body, "base = ci->u.l.base;\n");
}